

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH64_hash_t XXH64_digest(XXH64_state_t *state_in)

{
  ulong val;
  ulong val_00;
  ulong val_01;
  U32 UVar1;
  BYTE *pBVar2;
  U64 UVar3;
  ulong uVar4;
  XXH_endianess endian_detected;
  XXH64_state_t *state_in_local;
  U64 k1_1;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  U64 h64_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U64 k1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  U64 h64;
  BYTE *bEnd;
  BYTE *p;
  
  bEnd = (BYTE *)state_in->mem64;
  pBVar2 = (BYTE *)((long)state_in->mem64 + (ulong)state_in->memsize);
  if (state_in->total_len < 0x20) {
    v1 = state_in->v3 + 0x27d4eb2f165667c5;
  }
  else {
    uVar4 = state_in->v1;
    val = state_in->v2;
    val_00 = state_in->v3;
    val_01 = state_in->v4;
    UVar3 = XXH64_mergeRound((uVar4 << 1 | uVar4 >> 0x3f) + (val << 7 | val >> 0x39) +
                             (val_00 << 0xc | val_00 >> 0x34) + (val_01 << 0x12 | val_01 >> 0x2e),
                             uVar4);
    UVar3 = XXH64_mergeRound(UVar3,val);
    UVar3 = XXH64_mergeRound(UVar3,val_00);
    v1 = XXH64_mergeRound(UVar3,val_01);
  }
  v1 = state_in->total_len + v1;
  for (; bEnd + 8 <= pBVar2; bEnd = bEnd + 8) {
    UVar3 = XXH_read64(bEnd);
    UVar3 = XXH64_round(0,UVar3);
    v1 = ((UVar3 ^ v1) << 0x1b | (UVar3 ^ v1) >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (bEnd + 4 <= pBVar2) {
    UVar1 = XXH_read32(bEnd);
    uVar4 = (ulong)UVar1 * -0x61c8864e7a143579 ^ v1;
    v1 = (uVar4 << 0x17 | uVar4 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    bEnd = bEnd + 4;
  }
  for (; bEnd < pBVar2; bEnd = bEnd + 1) {
    uVar4 = (ulong)*bEnd * 0x27d4eb2f165667c5 ^ v1;
    v1 = (uVar4 << 0xb | uVar4 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar4 = (v1 >> 0x21 ^ v1) * -0x3d4d51c2d82b14b1;
  uVar4 = (uVar4 >> 0x1d ^ uVar4) * 0x165667b19e3779f9;
  return uVar4 >> 0x20 ^ uVar4;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64_digest (const XXH64_state_t* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}